

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O0

void __thiscall
google::
dense_hashtable<int,int,Hasher,google::dense_hash_set<int,Hasher,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>::Identity,google::dense_hash_set<int,Hasher,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SetKey,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>
::
insert<google::BaseHashtableInterface<google::dense_hash_set<int,Hasher,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>>::const_iterator>
          (void *param_1)

{
  const_iterator __first;
  const_iterator __last;
  int *piVar1;
  length_error *this;
  BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_00000008;
  dense_hashtable<int,_int,_Hasher,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *in_stack_00000010;
  pointer in_stack_00000018;
  undefined8 in_stack_00000020;
  BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_00000028;
  undefined8 in_stack_00000030;
  undefined8 in_stack_00000038;
  pointer in_stack_00000040;
  size_t dist;
  BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *v;
  dense_hashtable<int,_int,_Hasher,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *this_00;
  int *args;
  int *in_stack_ffffffffffffff78;
  dense_hashtable<int,_int,_Hasher,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *in_stack_ffffffffffffff80;
  const_iterator in_stack_ffffffffffffff90;
  int *local_18;
  dense_hashtable<int,_int,_Hasher,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *in_stack_fffffffffffffff8;
  
  __first.parent_ = in_stack_00000028;
  __first.super_const_iterator = in_stack_ffffffffffffff90;
  __last.super_const_iterator.pos = (pointer)in_stack_00000038;
  __last.super_const_iterator.ht =
       (dense_hashtable<int,_int,_Hasher,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)in_stack_00000030;
  __last.super_const_iterator.end = in_stack_00000040;
  __last.parent_ = in_stack_00000008;
  v = in_stack_00000008;
  this_00 = in_stack_00000010;
  local_18 = (int *)std::
                    distance<google::BaseHashtableInterface<google::dense_hash_set<int,Hasher,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>>::const_iterator>
                              (__first,__last);
  args = local_18;
  piVar1 = (int *)std::numeric_limits<unsigned_long>::max();
  if (piVar1 <= args) {
    this = (length_error *)__cxa_allocate_exception(0x10);
    std::length_error::length_error(this,"insert-range overflow");
    __cxa_throw(this,&std::length_error::typeinfo,std::length_error::~length_error);
  }
  dense_hashtable<int,_int,_Hasher,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::resize_delta(in_stack_fffffffffffffff8,(size_type)param_1);
  while (local_18 != (int *)0x0) {
    dense_hashtable_const_iterator<int,_int,_Hasher,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::operator*((dense_hashtable_const_iterator<int,_int,_Hasher,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                 *)&stack0x00000008);
    get_key<int_const&>(this_00,(int *)v);
    dense_hashtable_const_iterator<int,_int,_Hasher,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::operator*((dense_hashtable_const_iterator<int,_int,_Hasher,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                 *)&stack0x00000008);
    insert_noresize<int_const&,int_const&>(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,args)
    ;
    local_18 = (int *)((long)local_18 - 1);
    dense_hashtable_const_iterator<int,_int,_Hasher,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::operator++((dense_hashtable_const_iterator<int,_int,_Hasher,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *)this_00);
  }
  return;
}

Assistant:

void insert(ForwardIterator f, ForwardIterator l, std::forward_iterator_tag) {
    size_t dist = std::distance(f, l);
    if (dist >= (std::numeric_limits<size_type>::max)()) {
      throw std::length_error("insert-range overflow");
    }
    resize_delta(static_cast<size_type>(dist));
    for (; dist > 0; --dist, ++f) {
      insert_noresize(get_key(*f), *f);
    }
  }